

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall InterpreterTest_AddF32_Test::TestBody(InterpreterTest_AddF32_Test *this)

{
  allocator<wasm::Literal> *this_00;
  Literal LVar1;
  Literal LVar2;
  initializer_list<wasm::Literal> __l;
  bool bVar3;
  Err *pEVar4;
  char *pcVar5;
  char *in_R9;
  undefined8 in_stack_fffffffffffff7e8;
  undefined8 in_stack_fffffffffffff7f0;
  Type in_stack_fffffffffffff7f8;
  anon_union_16_6_1532cd5a_for_Literal_0 *local_7c8;
  AssertHelper local_768;
  Message local_760;
  undefined1 local_758 [8];
  AssertionResult gtest_ar;
  anon_union_16_6_1532cd5a_for_Literal_0 local_738;
  anon_union_16_6_1532cd5a_for_Literal_0 local_720;
  undefined1 local_710 [8];
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> expected;
  undefined1 local_6c0 [8];
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> results;
  AssertHelper local_688;
  Message local_680;
  bool local_671;
  undefined1 local_670 [8];
  AssertionResult gtest_ar__3;
  Result<wasm::Expression_*> expr;
  string local_638;
  AssertHelper local_618;
  Message local_610;
  Result<wasm::Ok> local_608 [47];
  bool local_5d9;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_5a8;
  Message local_5a0;
  Literal local_598;
  Result<wasm::Ok> local_580 [47];
  bool local_551;
  undefined1 local_550 [8];
  AssertionResult gtest_ar__1;
  string local_538;
  AssertHelper local_518;
  Message local_510;
  Literal local_508;
  Result<wasm::Ok> local_4f0 [47];
  bool local_4c1;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_;
  undefined1 local_4a0 [8];
  IRBuilder builder;
  Module wasm;
  InterpreterTest_AddF32_Test *this_local;
  
  ::wasm::Module::Module((Module *)&builder.blockHint);
  ::wasm::IRBuilder::IRBuilder((IRBuilder *)local_4a0,(Module *)&builder.blockHint);
  ::wasm::Literal::Literal(&local_508,0.0);
  LVar1.field_0.func.super_IString.str._M_str = (char *)in_stack_fffffffffffff7f0;
  LVar1.field_0.i64 = in_stack_fffffffffffff7e8;
  LVar1.type.id = in_stack_fffffffffffff7f8.id;
  ::wasm::IRBuilder::makeConst(LVar1);
  pEVar4 = ::wasm::Result<wasm::Ok>::getErr(local_4f0);
  local_4c1 = pEVar4 == (Err *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4c0,&local_4c1,(type *)0x0);
  ::wasm::Result<wasm::Ok>::~Result(local_4f0);
  ::wasm::Literal::~Literal(&local_508);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar3) {
    testing::Message::Message(&local_510);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_538,(internal *)local_4c0,
               (AssertionResult *)"builder.makeConst(Literal(float(0.0))).getErr()","true","false",
               in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_518,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
               ,0x24e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_518,&local_510);
    testing::internal::AssertHelper::~AssertHelper(&local_518);
    std::__cxx11::string::~string((string *)&local_538);
    testing::Message::~Message(&local_510);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar3;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    ::wasm::Literal::Literal(&local_598,1.0);
    LVar2.field_0.func.super_IString.str._M_str = (char *)in_stack_fffffffffffff7f0;
    LVar2.field_0.i64 = in_stack_fffffffffffff7e8;
    LVar2.type.id = in_stack_fffffffffffff7f8.id;
    ::wasm::IRBuilder::makeConst(LVar2);
    pEVar4 = ::wasm::Result<wasm::Ok>::getErr(local_580);
    local_551 = pEVar4 == (Err *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_550,&local_551,(type *)0x0);
    ::wasm::Result<wasm::Ok>::~Result(local_580);
    ::wasm::Literal::~Literal(&local_598);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
    if (!bVar3) {
      testing::Message::Message(&local_5a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_550,
                 (AssertionResult *)"builder.makeConst(Literal(float(1.0))).getErr()","true","false"
                 ,in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_5a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                 ,0x24f,pcVar5);
      testing::internal::AssertHelper::operator=(&local_5a8,&local_5a0);
      testing::internal::AssertHelper::~AssertHelper(&local_5a8);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_5a0);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar3;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      ::wasm::IRBuilder::makeBinary((BinaryOp)local_608);
      pEVar4 = ::wasm::Result<wasm::Ok>::getErr(local_608);
      local_5d9 = pEVar4 == (Err *)0x0;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_5d8,&local_5d9,(type *)0x0);
      ::wasm::Result<wasm::Ok>::~Result(local_608);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d8);
      if (!bVar3) {
        testing::Message::Message(&local_610);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_638,(internal *)local_5d8,
                   (AssertionResult *)"builder.makeBinary(AddFloat32).getErr()","true","false",in_R9
                  );
        pcVar5 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_618,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                   ,0x250,pcVar5);
        testing::internal::AssertHelper::operator=(&local_618,&local_610);
        testing::internal::AssertHelper::~AssertHelper(&local_618);
        std::__cxx11::string::~string((string *)&local_638);
        testing::Message::~Message(&local_610);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar3;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        ::wasm::IRBuilder::build();
        pEVar4 = ::wasm::Result<wasm::Expression_*>::getErr
                           ((Result<wasm::Expression_*> *)&gtest_ar__3.message_);
        local_671 = pEVar4 == (Err *)0x0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_670,&local_671,(type *)0x0);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
        if (!bVar3) {
          testing::Message::Message(&local_680);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)
                     &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_670,
                     (AssertionResult *)"expr.getErr()","true","false",in_R9);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_688,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                     ,0x253,pcVar5);
          testing::internal::AssertHelper::operator=(&local_688,&local_680);
          testing::internal::AssertHelper::~AssertHelper(&local_688);
          std::__cxx11::string::~string
                    ((string *)
                     &results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          testing::Message::~Message(&local_680);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar3;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ::wasm::Interpreter::Interpreter
                    ((Interpreter *)
                     &expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          ::wasm::Result<wasm::Expression_*>::operator*
                    ((Result<wasm::Expression_*> *)&gtest_ar__3.message_);
          ::wasm::Interpreter::runTest((Expression *)local_6c0);
          ::wasm::Interpreter::~Interpreter
                    ((Interpreter *)
                     &expected.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          ::wasm::Literal::Literal((Literal *)&local_738.func,1.0);
          local_720.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&local_738;
          local_720.func.super_IString.str._M_str = (char *)0x1;
          this_00 = (allocator<wasm::Literal> *)
                    ((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 7);
          std::allocator<wasm::Literal>::allocator(this_00);
          __l._M_len = (size_type)local_720.func.super_IString.str._M_str;
          __l._M_array = (iterator)local_720.i64;
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_710,__l,this_00)
          ;
          std::allocator<wasm::Literal>::~allocator
                    ((allocator<wasm::Literal> *)
                     ((long)&gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 7));
          local_7c8 = &local_720;
          do {
            local_7c8 = (anon_union_16_6_1532cd5a_for_Literal_0 *)((long)local_7c8 + -0x18);
            ::wasm::Literal::~Literal((Literal *)&local_7c8->func);
          } while (local_7c8 != &local_738);
          testing::internal::EqHelper::
          Compare<std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>,_nullptr>
                    ((EqHelper *)local_758,"results","expected",
                     (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_6c0,
                     (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_710);
          bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_758);
          if (!bVar3) {
            testing::Message::Message(&local_760);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_758);
            testing::internal::AssertHelper::AssertHelper
                      (&local_768,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/interpreter.cpp"
                       ,600,pcVar5);
            testing::internal::AssertHelper::operator=(&local_768,&local_760);
            testing::internal::AssertHelper::~AssertHelper(&local_768);
            testing::Message::~Message(&local_760);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_758);
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_710);
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                    ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_6c0);
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ = 0;
        }
        ::wasm::Result<wasm::Expression_*>::~Result
                  ((Result<wasm::Expression_*> *)&gtest_ar__3.message_);
      }
    }
  }
  ::wasm::IRBuilder::~IRBuilder((IRBuilder *)local_4a0);
  ::wasm::Module::~Module((Module *)&builder.blockHint);
  return;
}

Assistant:

TEST(InterpreterTest, AddF32) {
  Module wasm;
  IRBuilder builder(wasm);

  ASSERT_FALSE(builder.makeConst(Literal(float(0.0))).getErr());
  ASSERT_FALSE(builder.makeConst(Literal(float(1.0))).getErr());
  ASSERT_FALSE(builder.makeBinary(AddFloat32).getErr());

  auto expr = builder.build();
  ASSERT_FALSE(expr.getErr());

  auto results = Interpreter{}.runTest(*expr);
  std::vector<Literal> expected{Literal(float(1.0))};

  EXPECT_EQ(results, expected);
}